

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O3

int ssymm_(char *side,char *uplo,integer *m,integer *n,real *alpha,real *a,integer *lda,real *b,
          integer *ldb,real *beta,real *c__,integer *ldc)

{
  float fVar1;
  int iVar2;
  int iVar3;
  integer iVar4;
  logical lVar5;
  logical lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  real *prVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  real *prVar20;
  real *prVar21;
  int iVar22;
  integer *piVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  float fVar33;
  float fVar34;
  
  iVar22 = *lda;
  uVar8 = (ulong)iVar22;
  iVar2 = *ldb;
  uVar9 = (ulong)iVar2;
  iVar19 = *ldc;
  uVar10 = (ulong)iVar19;
  lVar5 = lsame_(side,"L");
  piVar23 = m;
  if (lVar5 == 0) {
    piVar23 = n;
  }
  iVar15 = *piVar23;
  lVar5 = lsame_(uplo,"U");
  ssymm_::info = 0;
  lVar6 = lsame_(side,"L");
  if ((lVar6 == 0) && (lVar6 = lsame_(side,"R"), lVar6 == 0)) {
    iVar4 = 1;
  }
  else if ((lVar5 == 0) && (lVar6 = lsame_(uplo,"L"), lVar6 == 0)) {
    iVar4 = 2;
  }
  else {
    iVar11 = *m;
    if (iVar11 < 0) {
      iVar4 = 3;
    }
    else {
      uVar29 = (ulong)(uint)*n;
      if (*n < 0) {
        iVar4 = 4;
      }
      else {
        iVar7 = 1;
        if (1 < iVar15) {
          iVar7 = iVar15;
        }
        iVar4 = 7;
        if (iVar7 <= *lda) {
          iVar15 = iVar11 + (uint)(iVar11 == 0);
          iVar4 = 9;
          if (((iVar15 <= *ldb) && (iVar4 = 0xc, iVar15 <= *ldc)) &&
             (iVar4 = ssymm_::info, ssymm_::info == 0)) {
            if (uVar29 == 0 || iVar11 == 0) {
              return 0;
            }
            uVar17 = ~uVar10;
            if ((*alpha != 0.0) || (NAN(*alpha))) {
              uVar29 = ~uVar8;
              uVar30 = ~uVar9;
              lVar6 = lsame_(side,"L");
              uVar16 = *n;
              uVar25 = (ulong)uVar16;
              if (lVar6 == 0) {
                if ((int)uVar16 < 1) {
                  return 0;
                }
                iVar19 = *m;
                iVar15 = *n;
                iVar11 = 1;
                if (lVar5 != 0) {
                  iVar11 = iVar22;
                }
                uVar26 = 1;
                uVar28 = 1;
                if (lVar5 == 0) {
                  uVar28 = uVar8;
                }
                prVar20 = c__ + uVar10 + uVar17;
                iVar7 = iVar2 * 2;
                prVar21 = b + uVar9 + uVar30;
                do {
                  fVar33 = *alpha;
                  fVar34 = a[uVar29 + (long)((iVar22 + 1) * (int)uVar26)];
                  if ((*beta != 0.0) || (NAN(*beta))) {
                    if (0 < iVar19) {
                      uVar17 = 1;
                      do {
                        prVar20[uVar17] =
                             *beta * prVar20[uVar17] + prVar21[uVar17] * fVar33 * fVar34;
                        uVar17 = uVar17 + 1;
                      } while (iVar19 + 1 != uVar17);
                    }
                  }
                  else if (0 < iVar19) {
                    uVar17 = 1;
                    do {
                      prVar20[uVar17] = prVar21[uVar17] * fVar33 * fVar34;
                      uVar17 = uVar17 + 1;
                    } while (iVar19 + 1 != uVar17);
                  }
                  if (1 < uVar26) {
                    iVar3 = *m;
                    uVar17 = 1;
                    prVar14 = b + uVar9 + uVar30;
                    do {
                      lVar18 = uVar26 * uVar8 + uVar17;
                      if (lVar5 == 0) {
                        lVar18 = uVar26 + uVar17 * uVar8;
                      }
                      if (0 < iVar3) {
                        fVar33 = *alpha;
                        fVar34 = a[uVar29 + lVar18];
                        uVar31 = 1;
                        do {
                          prVar20[uVar31] = prVar14[uVar31] * fVar33 * fVar34 + prVar20[uVar31];
                          uVar31 = uVar31 + 1;
                        } while (iVar3 + 1 != uVar31);
                      }
                      uVar17 = uVar17 + 1;
                      prVar14 = prVar14 + uVar9;
                    } while (uVar17 != uVar26);
                  }
                  if ((int)uVar26 < iVar15) {
                    iVar3 = *m;
                    uVar17 = uVar26 & 0xffffffff;
                    iVar12 = iVar7;
                    do {
                      uVar16 = (int)uVar17 + 1;
                      uVar17 = (ulong)uVar16;
                      if (0 < iVar3) {
                        fVar33 = *alpha;
                        fVar34 = a[uVar29 + uVar26 * uVar28 + (long)(int)(uVar16 * iVar11)];
                        uVar31 = 1;
                        do {
                          prVar20[uVar31] =
                               b[uVar30 + (long)iVar12 + uVar31] * fVar33 * fVar34 + prVar20[uVar31]
                          ;
                          uVar31 = uVar31 + 1;
                        } while (iVar3 + 1 != uVar31);
                      }
                      iVar12 = iVar12 + iVar2;
                    } while ((int)uVar16 < iVar15);
                  }
                  uVar26 = uVar26 + 1;
                  prVar21 = prVar21 + uVar9;
                  prVar20 = prVar20 + uVar10;
                  iVar7 = iVar7 + iVar2;
                } while (uVar26 != uVar25 + 1);
                return 0;
              }
              if (lVar5 != 0) {
                if ((int)uVar16 < 1) {
                  return 0;
                }
                uVar16 = *m;
                prVar21 = b + uVar9 + uVar30 + 1;
                prVar20 = c__ + uVar10 + uVar17 + 1;
                lVar18 = 1;
                do {
                  if (0 < (int)uVar16) {
                    lVar27 = lVar18 * uVar10;
                    uVar28 = 1;
                    lVar24 = 0;
                    prVar14 = a + uVar29 + uVar8 + 1;
                    do {
                      fVar33 = *alpha * b[uVar30 + lVar18 * uVar9 + uVar28];
                      fVar34 = 0.0;
                      if (1 < uVar28) {
                        lVar13 = 0;
                        do {
                          prVar20[lVar13] = prVar14[lVar13] * fVar33 + prVar20[lVar13];
                          fVar34 = fVar34 + prVar21[lVar13] * prVar14[lVar13];
                          lVar13 = lVar13 + 1;
                        } while (lVar24 != lVar13);
                      }
                      fVar1 = *beta;
                      lVar13 = (long)((iVar22 + 1) * (int)uVar28);
                      if ((fVar1 != 0.0) || (NAN(fVar1))) {
                        c__[uVar17 + lVar27 + uVar28] =
                             fVar34 * *alpha +
                             fVar1 * c__[uVar17 + lVar27 + uVar28] + fVar33 * a[uVar29 + lVar13];
                      }
                      else {
                        c__[uVar17 + lVar27 + uVar28] =
                             fVar33 * a[uVar29 + lVar13] + fVar34 * *alpha;
                      }
                      uVar28 = uVar28 + 1;
                      prVar14 = prVar14 + uVar8;
                      lVar24 = lVar24 + 1;
                    } while (uVar28 != (ulong)uVar16 + 1);
                  }
                  lVar18 = lVar18 + 1;
                  prVar21 = prVar21 + uVar9;
                  prVar20 = prVar20 + uVar10;
                } while (lVar18 != uVar25 + 1);
                return 0;
              }
              if ((int)uVar16 < 1) {
                return 0;
              }
              uVar16 = *m;
              lVar18 = 1;
              do {
                if (0 < (int)uVar16) {
                  lVar24 = lVar18 * uVar10;
                  iVar2 = *m;
                  uVar28 = (ulong)uVar16;
                  iVar19 = uVar16 + 1;
                  do {
                    fVar33 = *alpha * b[uVar30 + lVar18 * uVar9 + uVar28];
                    fVar34 = 0.0;
                    if ((int)uVar28 < iVar2) {
                      iVar15 = iVar19;
                      do {
                        lVar27 = (long)iVar15;
                        c__[uVar17 + lVar24 + lVar27] =
                             a[uVar29 + uVar28 * uVar8 + lVar27] * fVar33 +
                             c__[uVar17 + lVar24 + lVar27];
                        fVar34 = fVar34 + b[uVar30 + lVar18 * uVar9 + lVar27] *
                                          a[uVar29 + uVar28 * uVar8 + lVar27];
                        bVar32 = iVar15 != iVar2;
                        iVar15 = iVar15 + 1;
                      } while (bVar32);
                    }
                    fVar1 = *beta;
                    lVar27 = (long)((iVar22 + 1) * (int)uVar28);
                    if ((fVar1 != 0.0) || (NAN(fVar1))) {
                      c__[uVar17 + lVar24 + uVar28] =
                           fVar34 * *alpha +
                           fVar1 * c__[uVar17 + lVar24 + uVar28] + fVar33 * a[uVar29 + lVar27];
                    }
                    else {
                      c__[uVar17 + lVar24 + uVar28] = fVar33 * a[uVar29 + lVar27] + fVar34 * *alpha;
                    }
                    iVar19 = iVar19 + -1;
                    bVar32 = 1 < (long)uVar28;
                    uVar28 = uVar28 - 1;
                  } while (bVar32);
                }
                lVar18 = lVar18 + 1;
              } while (lVar18 != uVar25 + 1);
              return 0;
            }
            fVar33 = *beta;
            if ((fVar33 == 1.0) && (!NAN(fVar33))) {
              return 0;
            }
            if ((fVar33 == 0.0) && (!NAN(fVar33))) {
              iVar22 = iVar19 + 1;
              uVar16 = *m;
              do {
                if (0 < (int)uVar16) {
                  memset(c__ + uVar17 + (long)iVar22,0,(ulong)uVar16 << 2);
                }
                iVar22 = iVar22 + iVar19;
                uVar29 = uVar29 - 1;
              } while (uVar29 != 0);
              return 0;
            }
            iVar22 = *m;
            prVar21 = c__ + uVar10 + uVar17;
            lVar18 = 1;
            do {
              if (0 < iVar22) {
                uVar8 = 1;
                do {
                  prVar21[uVar8] = *beta * prVar21[uVar8];
                  uVar8 = uVar8 + 1;
                } while (iVar22 + 1 != uVar8);
              }
              lVar18 = lVar18 + 1;
              prVar21 = prVar21 + uVar10;
            } while (lVar18 != uVar29 + 1);
            return 0;
          }
        }
      }
    }
  }
  ssymm_::info = iVar4;
  xerbla_("SSYMM ",&ssymm_::info);
  return 0;
}

Assistant:

int ssymm_(char *side, char *uplo, integer *m, integer *n,
	real *alpha, real *a, integer *lda, real *b, integer *ldb, real *beta,
	 real *c__, integer *ldc)
{
    /* System generated locals */
    integer a_dim1, a_offset, b_dim1, b_offset, c_dim1, c_offset, i__1, i__2,
	    i__3;

    /* Local variables */
    static integer i__, j, k, info;
    static real temp1, temp2;
    extern logical lsame_(char *, char *);
    static integer nrowa;
    static logical upper;
    extern /* Subroutine */ int xerbla_(char *, integer *);


/*
    Purpose
    =======

    SSYMM  performs one of the matrix-matrix operations

       C := alpha*A*B + beta*C,

    or

       C := alpha*B*A + beta*C,

    where alpha and beta are scalars,  A is a symmetric matrix and  B and
    C are  m by n matrices.

    Parameters
    ==========

    SIDE   - CHARACTER*1.
             On entry,  SIDE  specifies whether  the  symmetric matrix  A
             appears on the  left or right  in the  operation as follows:

                SIDE = 'L' or 'l'   C := alpha*A*B + beta*C,

                SIDE = 'R' or 'r'   C := alpha*B*A + beta*C,

             Unchanged on exit.

    UPLO   - CHARACTER*1.
             On  entry,   UPLO  specifies  whether  the  upper  or  lower
             triangular  part  of  the  symmetric  matrix   A  is  to  be
             referenced as follows:

                UPLO = 'U' or 'u'   Only the upper triangular part of the
                                    symmetric matrix is to be referenced.

                UPLO = 'L' or 'l'   Only the lower triangular part of the
                                    symmetric matrix is to be referenced.

             Unchanged on exit.

    M      - INTEGER.
             On entry,  M  specifies the number of rows of the matrix  C.
             M  must be at least zero.
             Unchanged on exit.

    N      - INTEGER.
             On entry, N specifies the number of columns of the matrix C.
             N  must be at least zero.
             Unchanged on exit.

    ALPHA  - REAL            .
             On entry, ALPHA specifies the scalar alpha.
             Unchanged on exit.

    A      - REAL             array of DIMENSION ( LDA, ka ), where ka is
             m  when  SIDE = 'L' or 'l'  and is  n otherwise.
             Before entry  with  SIDE = 'L' or 'l',  the  m by m  part of
             the array  A  must contain the  symmetric matrix,  such that
             when  UPLO = 'U' or 'u', the leading m by m upper triangular
             part of the array  A  must contain the upper triangular part
             of the  symmetric matrix and the  strictly  lower triangular
             part of  A  is not referenced,  and when  UPLO = 'L' or 'l',
             the leading  m by m  lower triangular part  of the  array  A
             must  contain  the  lower triangular part  of the  symmetric
             matrix and the  strictly upper triangular part of  A  is not
             referenced.
             Before entry  with  SIDE = 'R' or 'r',  the  n by n  part of
             the array  A  must contain the  symmetric matrix,  such that
             when  UPLO = 'U' or 'u', the leading n by n upper triangular
             part of the array  A  must contain the upper triangular part
             of the  symmetric matrix and the  strictly  lower triangular
             part of  A  is not referenced,  and when  UPLO = 'L' or 'l',
             the leading  n by n  lower triangular part  of the  array  A
             must  contain  the  lower triangular part  of the  symmetric
             matrix and the  strictly upper triangular part of  A  is not
             referenced.
             Unchanged on exit.

    LDA    - INTEGER.
             On entry, LDA specifies the first dimension of A as declared
             in the calling (sub) program.  When  SIDE = 'L' or 'l'  then
             LDA must be at least  max( 1, m ), otherwise  LDA must be at
             least  max( 1, n ).
             Unchanged on exit.

    B      - REAL             array of DIMENSION ( LDB, n ).
             Before entry, the leading  m by n part of the array  B  must
             contain the matrix B.
             Unchanged on exit.

    LDB    - INTEGER.
             On entry, LDB specifies the first dimension of B as declared
             in  the  calling  (sub)  program.   LDB  must  be  at  least
             max( 1, m ).
             Unchanged on exit.

    BETA   - REAL            .
             On entry,  BETA  specifies the scalar  beta.  When  BETA  is
             supplied as zero then C need not be set on input.
             Unchanged on exit.

    C      - REAL             array of DIMENSION ( LDC, n ).
             Before entry, the leading  m by n  part of the array  C must
             contain the matrix  C,  except when  beta  is zero, in which
             case C need not be set on entry.
             On exit, the array  C  is overwritten by the  m by n updated
             matrix.

    LDC    - INTEGER.
             On entry, LDC specifies the first dimension of C as declared
             in  the  calling  (sub)  program.   LDC  must  be  at  least
             max( 1, m ).
             Unchanged on exit.


    Level 3 Blas routine.

    -- Written on 8-February-1989.
       Jack Dongarra, Argonne National Laboratory.
       Iain Duff, AERE Harwell.
       Jeremy Du Croz, Numerical Algorithms Group Ltd.
       Sven Hammarling, Numerical Algorithms Group Ltd.


       Set NROWA as the number of rows of A.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;
    b_dim1 = *ldb;
    b_offset = 1 + b_dim1;
    b -= b_offset;
    c_dim1 = *ldc;
    c_offset = 1 + c_dim1;
    c__ -= c_offset;

    /* Function Body */
    if (lsame_(side, "L")) {
	nrowa = *m;
    } else {
	nrowa = *n;
    }
    upper = lsame_(uplo, "U");

/*     Test the input parameters. */

    info = 0;
    if (! lsame_(side, "L") && ! lsame_(side, "R")) {
	info = 1;
    } else if (! upper && ! lsame_(uplo, "L")) {
	info = 2;
    } else if (*m < 0) {
	info = 3;
    } else if (*n < 0) {
	info = 4;
    } else if (*lda < max(1,nrowa)) {
	info = 7;
    } else if (*ldb < max(1,*m)) {
	info = 9;
    } else if (*ldc < max(1,*m)) {
	info = 12;
    }
    if (info != 0) {
	xerbla_("SSYMM ", &info);
	return 0;
    }

/*     Quick return if possible. */

    if (*m == 0 || *n == 0 || (*alpha == 0.f && *beta == 1.f)) {
	return 0;
    }

/*     And when  alpha.eq.zero. */

    if (*alpha == 0.f) {
	if (*beta == 0.f) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    c__[i__ + j * c_dim1] = 0.f;
/* L10: */
		}
/* L20: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L30: */
		}
/* L40: */
	    }
	}
	return 0;
    }

/*     Start the operations. */

    if (lsame_(side, "L")) {

/*        Form  C := alpha*A*B + beta*C. */

	if (upper) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    temp1 = *alpha * b[i__ + j * b_dim1];
		    temp2 = 0.f;
		    i__3 = i__ - 1;
		    for (k = 1; k <= i__3; ++k) {
			c__[k + j * c_dim1] += temp1 * a[k + i__ * a_dim1];
			temp2 += b[k + j * b_dim1] * a[k + i__ * a_dim1];
/* L50: */
		    }
		    if (*beta == 0.f) {
			c__[i__ + j * c_dim1] = temp1 * a[i__ + i__ * a_dim1]
				+ *alpha * temp2;
		    } else {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1]
				+ temp1 * a[i__ + i__ * a_dim1] + *alpha *
				temp2;
		    }
/* L60: */
		}
/* L70: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		for (i__ = *m; i__ >= 1; --i__) {
		    temp1 = *alpha * b[i__ + j * b_dim1];
		    temp2 = 0.f;
		    i__2 = *m;
		    for (k = i__ + 1; k <= i__2; ++k) {
			c__[k + j * c_dim1] += temp1 * a[k + i__ * a_dim1];
			temp2 += b[k + j * b_dim1] * a[k + i__ * a_dim1];
/* L80: */
		    }
		    if (*beta == 0.f) {
			c__[i__ + j * c_dim1] = temp1 * a[i__ + i__ * a_dim1]
				+ *alpha * temp2;
		    } else {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1]
				+ temp1 * a[i__ + i__ * a_dim1] + *alpha *
				temp2;
		    }
/* L90: */
		}
/* L100: */
	    }
	}
    } else {

/*        Form  C := alpha*B*A + beta*C. */

	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    temp1 = *alpha * a[j + j * a_dim1];
	    if (*beta == 0.f) {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    c__[i__ + j * c_dim1] = temp1 * b[i__ + j * b_dim1];
/* L110: */
		}
	    } else {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1] +
			    temp1 * b[i__ + j * b_dim1];
/* L120: */
		}
	    }
	    i__2 = j - 1;
	    for (k = 1; k <= i__2; ++k) {
		if (upper) {
		    temp1 = *alpha * a[k + j * a_dim1];
		} else {
		    temp1 = *alpha * a[j + k * a_dim1];
		}
		i__3 = *m;
		for (i__ = 1; i__ <= i__3; ++i__) {
		    c__[i__ + j * c_dim1] += temp1 * b[i__ + k * b_dim1];
/* L130: */
		}
/* L140: */
	    }
	    i__2 = *n;
	    for (k = j + 1; k <= i__2; ++k) {
		if (upper) {
		    temp1 = *alpha * a[j + k * a_dim1];
		} else {
		    temp1 = *alpha * a[k + j * a_dim1];
		}
		i__3 = *m;
		for (i__ = 1; i__ <= i__3; ++i__) {
		    c__[i__ + j * c_dim1] += temp1 * b[i__ + k * b_dim1];
/* L150: */
		}
/* L160: */
	    }
/* L170: */
	}
    }

    return 0;

/*     End of SSYMM . */

}